

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

Scal __thiscall LinearExpert::queryZ(LinearExpert *this,Z *z)

{
  Z *pZVar1;
  Scal SVar2;
  int iVar3;
  double dVar4;
  ResScalar RVar5;
  type tVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Z dzAux;
  Z aux2;
  void *local_78 [2];
  void *local_68;
  RhsNested local_60;
  undefined1 local_58 [24];
  scalar_constant_op<double> local_40;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_38;
  
  local_58._8_8_ = &this->Nu;
  pZVar1 = &this->dz;
  local_58._0_8_ = z;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (pZVar1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_58);
  local_58._0_8_ = &this->Lambda;
  local_58._16_8_ = &this->Mu;
  local_58._8_8_ = pZVar1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&this->pred_x,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_58);
  dVar9 = this->Sh;
  dVar7 = this->wNu;
  iVar3 = this->d;
  dVar4 = this->wSigma + dVar9;
  local_58._0_8_ = &this->invSigma;
  local_58._8_8_ = pZVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_68,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_58);
  RVar5 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pZVar1,
                (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_68);
  dVar9 = dVar9 + dVar7;
  dVar8 = (dVar4 + (double)iVar3 +
          *(double *)(&DAT_001cdf00 + (ulong)(-(uint)(dVar7 == 0.0) & 1) * 8)) *
          ((dVar9 + 1.0) / dVar9);
  this->dz_invSigma_dz = RVar5;
  dVar9 = RVar5 / dVar8 + 1.0;
  dVar7 = (dVar4 - (double)iVar3) + 1.0;
  local_40.m_other = (((double)this->d + dVar7) / dVar8) / dVar9;
  local_58._8_8_ = local_60;
  local_38 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_68;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&this->kappa,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_58);
  dVar9 = pow(dVar9,((double)this->d + dVar7) * -0.5);
  this->rbf_z = dVar9;
  dVar9 = this->sqrtDetInvSigma;
  tVar6 = boost::math::tgamma_delta_ratio<double,double>(dVar7 * 0.5,(double)this->d * 0.5);
  dVar7 = pow(2.0 / dVar8,(double)this->d * 0.5);
  this->p_z_T = dVar7 * (dVar9 / tVar6) * this->rbf_z;
  local_58._8_8_ = &this->Sz;
  local_58._16_8_ =
       (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_38 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this->Sh;
  local_58._0_8_ = z;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
              *)local_58);
  local_58._0_8_ = &this->varLambda;
  pZVar1 = &this->dGamma;
  local_58._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            (pZVar1,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                     *)local_58);
  dVar9 = this->Sh;
  RVar5 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_78,
                (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pZVar1);
  this->gamma = 1.0 / dVar9 + RVar5;
  local_58._0_8_ = (LhsNested)0x4000000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pZVar1,(Scalar *)local_58);
  SVar2 = this->p_z_T;
  free(local_78[0]);
  free(local_68);
  return SVar2;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryZ( Z const &z )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;

    Scal dof = wSigma + Sh - d + 1.0;
    Scal aux1 = (wNu + Sh + 1.0) / (wNu + Sh) * (wSigma + Sh + d + (wNu == 0.0 ? 1.0 : 2.0));

    Z aux2 = invSigma * dz;
    dz_invSigma_dz = dz.dot( aux2 );
    Scal aux3 = 1.0 + dz_invSigma_dz / aux1;
    kappa = ( (dof+d)/aux1/aux3 ) * aux2;

    rbf_z = pow(aux3 , -0.5*(dof+d) );
    p_z_T = sqrtDetInvSigma / boost::math::tgamma_delta_ratio(0.5*dof, 0.5*d) * pow(2.0/aux1, 0.5*d) * rbf_z;

    Z dzAux = z - Sz/Sh;
    dGamma = varLambda * dzAux;
    gamma = 1.0/Sh + dzAux.dot( dGamma );
    dGamma *= 2.0;

    return p_z_T;
}